

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
          (double *begin,double *end,ulong param_3)

{
  double *pdVar1;
  uchar *offsets_l;
  double dVar2;
  double dVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  long lVar5;
  ulong uVar6;
  size_t i;
  double *pdVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  double __tmp;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar17;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_180;
  ulong local_178;
  byte local_101;
  uchar local_100 [127];
  byte bStack_81;
  uchar local_80 [80];
  
  dVar2 = *begin;
  lVar5 = 0;
  do {
    dVar3 = *(double *)((long)begin + lVar5 + 8);
    lVar5 = lVar5 + 8;
  } while (dVar3 < dVar2);
  pdVar1 = (double *)((long)begin + lVar5);
  pdVar12 = end;
  if (lVar5 == 8) {
    do {
      if (end <= pdVar1) break;
      pdVar12 = end + -1;
      pdVar15 = end + -1;
      end = pdVar12;
    } while (dVar2 < *pdVar15 || dVar2 == *pdVar15);
  }
  else {
    do {
      end = pdVar12 + -1;
      pdVar15 = pdVar12 + -1;
      pdVar12 = end;
    } while (dVar2 < *pdVar15 || dVar2 == *pdVar15);
  }
  pdVar12 = pdVar1;
  if (pdVar1 < end) {
    pdVar12 = (double *)((long)begin + lVar5) + 1;
    *(double *)((long)begin + lVar5) = *end;
    *end = dVar3;
    uVar16 = 0;
    uVar11 = 0;
    local_178 = 0;
    first._M_current = pdVar12;
    lVar5 = 0;
    pdVar15 = end;
    local_180._M_current = end;
    while (uVar13 = 0, pdVar12 < pdVar15) {
      uVar6 = (long)pdVar15 - (long)pdVar12 >> 3;
      uVar10 = uVar6 >> (uVar11 == 0);
      if (uVar16 != 0) {
        uVar10 = uVar13;
      }
      uVar6 = uVar6 - uVar10;
      if (uVar11 != 0) {
        uVar6 = uVar13;
      }
      pdVar7 = pdVar12;
      if (uVar10 < 0x40) {
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          local_80[uVar16] = (char)uVar8;
          uVar16 = uVar16 + (dVar2 < *pdVar7 || dVar2 == *pdVar7);
          pdVar7 = pdVar7 + 1;
        }
      }
      else {
        for (uVar10 = 0; uVar10 < 0x40; uVar10 = uVar10 + 8) {
          cVar9 = (char)uVar10;
          local_80[uVar16] = cVar9;
          lVar14 = (dVar2 < pdVar12[uVar10] || dVar2 == pdVar12[uVar10]) + uVar16;
          local_80[lVar14] = cVar9 + '\x01';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 1] || dVar2 == pdVar12[uVar10 + 1]) + lVar14;
          local_80[lVar14] = cVar9 + '\x02';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 2] || dVar2 == pdVar12[uVar10 + 2]) + lVar14;
          local_80[lVar14] = cVar9 + '\x03';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 3] || dVar2 == pdVar12[uVar10 + 3]) + lVar14;
          local_80[lVar14] = cVar9 + '\x04';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 4] || dVar2 == pdVar12[uVar10 + 4]) + lVar14;
          local_80[lVar14] = cVar9 + '\x05';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 5] || dVar2 == pdVar12[uVar10 + 5]) + lVar14;
          local_80[lVar14] = cVar9 + '\x06';
          lVar14 = (ulong)(dVar2 < pdVar12[uVar10 + 6] || dVar2 == pdVar12[uVar10 + 6]) + lVar14;
          local_80[lVar14] = cVar9 + '\a';
          uVar16 = (ulong)(dVar2 < pdVar12[uVar10 + 7] || dVar2 == pdVar12[uVar10 + 7]) + lVar14;
          pdVar7 = pdVar7 + 8;
        }
      }
      if (uVar6 < 0x40) {
        uVar10 = 0;
        while (uVar6 != uVar10) {
          uVar10 = uVar10 + 1;
          local_100[uVar11] = (char)uVar10;
          pdVar12 = pdVar15 + -1;
          pdVar15 = pdVar15 + -1;
          uVar11 = uVar11 + (*pdVar12 <= dVar2 && dVar2 != *pdVar12);
        }
      }
      else {
        uVar10 = 0;
        while (uVar10 < 0x40) {
          cVar9 = (char)uVar10;
          local_100[uVar11] = cVar9 + '\x01';
          lVar14 = (pdVar15[-1] <= dVar2 && dVar2 != pdVar15[-1]) + uVar11;
          local_100[lVar14] = cVar9 + '\x02';
          lVar14 = (ulong)(pdVar15[-2] <= dVar2 && dVar2 != pdVar15[-2]) + lVar14;
          local_100[lVar14] = cVar9 + '\x03';
          lVar14 = (ulong)(pdVar15[-3] <= dVar2 && dVar2 != pdVar15[-3]) + lVar14;
          local_100[lVar14] = cVar9 + '\x04';
          lVar14 = (ulong)(pdVar15[-4] <= dVar2 && dVar2 != pdVar15[-4]) + lVar14;
          local_100[lVar14] = cVar9 + '\x05';
          lVar14 = (ulong)(pdVar15[-5] <= dVar2 && dVar2 != pdVar15[-5]) + lVar14;
          local_100[lVar14] = cVar9 + '\x06';
          lVar14 = (ulong)(pdVar15[-6] <= dVar2 && dVar2 != pdVar15[-6]) + lVar14;
          local_100[lVar14] = cVar9 + '\a';
          lVar14 = (ulong)(pdVar15[-7] <= dVar2 && dVar2 != pdVar15[-7]) + lVar14;
          uVar10 = uVar10 + 8;
          local_100[lVar14] = (char)uVar10;
          pdVar12 = pdVar15 + -8;
          pdVar15 = pdVar15 + -8;
          uVar11 = (ulong)(*pdVar12 <= dVar2 && dVar2 != *pdVar12) + lVar14;
        }
      }
      uVar10 = uVar16;
      if (uVar11 < uVar16) {
        uVar10 = uVar11;
      }
      offsets_l = local_80 + local_178;
      local_178 = local_178 + uVar10;
      _Var4._M_current = first._M_current;
      if (uVar16 <= uVar11) {
        local_178 = uVar13;
        _Var4._M_current = pdVar7;
      }
      swap_offsets<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (first,local_180,offsets_l,local_100 + lVar5,uVar10,uVar16 == uVar11);
      uVar16 = uVar16 - uVar10;
      uVar11 = uVar11 - uVar10;
      param_3 = extraout_RDX;
      pdVar12 = pdVar7;
      first._M_current = _Var4._M_current;
      lVar5 = lVar5 + uVar10;
      if (uVar11 == 0) {
        lVar5 = 0;
        local_180._M_current = pdVar15;
      }
    }
    if (uVar16 != 0) {
      while (pdVar12 = pdVar15, uVar16 != 0) {
        param_3 = (ulong)(&bStack_81)[uVar16 + local_178];
        dVar3 = first._M_current[param_3];
        first._M_current[param_3] = pdVar12[-1];
        pdVar12[-1] = dVar3;
        pdVar15 = pdVar12 + -1;
        uVar16 = uVar16 - 1;
      }
    }
    if (uVar11 != 0) {
      while (uVar11 != 0) {
        param_3 = (ulong)(&local_101)[uVar11 + lVar5] * 8;
        dVar3 = local_180._M_current[-(ulong)(&local_101)[uVar11 + lVar5]];
        local_180._M_current[-(ulong)(&local_101)[uVar11 + lVar5]] = *pdVar12;
        *pdVar12 = dVar3;
        pdVar12 = pdVar12 + 1;
        uVar11 = uVar11 - 1;
      }
    }
  }
  pVar17._9_7_ = (undefined7)(param_3 >> 8);
  pVar17.second = end <= pdVar1;
  *begin = pdVar12[-1];
  pdVar12[-1] = dVar2;
  pVar17.first._M_current = pdVar12 + -1;
  return pVar17;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }